

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined4 uVar71;
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  byte bVar85;
  int iVar86;
  undefined4 uVar87;
  ulong uVar88;
  long lVar89;
  ulong uVar90;
  uint uVar91;
  ulong uVar92;
  Scene *pSVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  vint4 bi;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  vint4 ai;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  float fVar117;
  float fVar120;
  float fVar121;
  undefined1 auVar118 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar119 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar137;
  undefined1 auVar138 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [64];
  undefined1 auVar146 [32];
  uint uVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  uint uVar154;
  undefined1 auVar147 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_bc4;
  RTCIntersectArguments *local_bc0;
  Geometry *local_bb8;
  long local_bb0;
  long local_ba8;
  ulong local_ba0;
  ulong local_b98;
  ulong *local_b90;
  RayQueryContext *local_b88;
  undefined1 local_b80 [32];
  float local_b60;
  float local_b5c;
  float local_b58;
  float local_b54;
  undefined4 local_b50;
  undefined4 local_b4c;
  uint local_b48;
  uint local_b44;
  uint local_b40;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800 [250];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar117 = ray->tfar;
    if (0.0 <= fVar117) {
      local_b90 = local_800 + 1;
      aVar2 = (ray->dir).field_0;
      auVar98 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar118._8_4_ = 0x7fffffff;
      auVar118._0_8_ = 0x7fffffff7fffffff;
      auVar118._12_4_ = 0x7fffffff;
      auVar118 = vandps_avx((undefined1  [16])aVar2,auVar118);
      auVar128._8_4_ = 0x219392ef;
      auVar128._0_8_ = 0x219392ef219392ef;
      auVar128._12_4_ = 0x219392ef;
      auVar118 = vcmpps_avx(auVar118,auVar128,1);
      auVar118 = vblendvps_avx((undefined1  [16])aVar2,auVar128,auVar118);
      auVar128 = vrcpps_avx(auVar118);
      fVar121 = auVar128._0_4_;
      auVar113._0_4_ = fVar121 * auVar118._0_4_;
      fVar122 = auVar128._4_4_;
      auVar113._4_4_ = fVar122 * auVar118._4_4_;
      fVar123 = auVar128._8_4_;
      auVar113._8_4_ = fVar123 * auVar118._8_4_;
      fVar125 = auVar128._12_4_;
      auVar113._12_4_ = fVar125 * auVar118._12_4_;
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = 0x3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar118 = vsubps_avx(auVar129,auVar113);
      auVar114._0_4_ = fVar121 + fVar121 * auVar118._0_4_;
      auVar114._4_4_ = fVar122 + fVar122 * auVar118._4_4_;
      auVar114._8_4_ = fVar123 + fVar123 * auVar118._8_4_;
      auVar114._12_4_ = fVar125 + fVar125 * auVar118._12_4_;
      uVar87 = *(undefined4 *)&(ray->org).field_0;
      local_a30._4_4_ = uVar87;
      local_a30._0_4_ = uVar87;
      local_a30._8_4_ = uVar87;
      local_a30._12_4_ = uVar87;
      auVar134 = ZEXT1664(local_a30);
      uVar87 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_a40._4_4_ = uVar87;
      local_a40._0_4_ = uVar87;
      local_a40._8_4_ = uVar87;
      local_a40._12_4_ = uVar87;
      auVar136 = ZEXT1664(local_a40);
      uVar87 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_a50._4_4_ = uVar87;
      local_a50._0_4_ = uVar87;
      local_a50._8_4_ = uVar87;
      local_a50._12_4_ = uVar87;
      auVar139 = ZEXT1664(local_a50);
      local_a60 = vshufps_avx(auVar114,auVar114,0);
      auVar147 = ZEXT1664(local_a60);
      auVar118 = vmovshdup_avx(auVar114);
      local_a70 = vshufps_avx(auVar114,auVar114,0x55);
      auVar156 = ZEXT1664(local_a70);
      auVar128 = vshufpd_avx(auVar114,auVar114,1);
      local_b98 = (ulong)(auVar114._0_4_ < 0.0) << 4;
      local_ba0 = (ulong)(auVar118._0_4_ < 0.0) << 4 | 0x20;
      local_a80 = vshufps_avx(auVar114,auVar114,0xaa);
      auVar116 = ZEXT1664(local_a80);
      uVar95 = (ulong)(auVar128._0_4_ < 0.0) << 4 | 0x40;
      uVar96 = local_b98 ^ 0x10;
      uVar97 = local_ba0 ^ 0x10;
      local_a90 = vshufps_avx(auVar98,auVar98,0);
      auVar119 = ZEXT1664(local_a90);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      local_9e0 = vperm2f128_avx(local_a20,mm_lookupmask_ps._0_32_,2);
      local_aa0 = vshufps_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),0);
      auVar131 = ZEXT1664(local_aa0);
      auVar99._8_4_ = 0xbf800000;
      auVar99._0_8_ = 0xbf800000bf800000;
      auVar99._12_4_ = 0xbf800000;
      auVar99._16_4_ = 0xbf800000;
      auVar99._20_4_ = 0xbf800000;
      auVar99._24_4_ = 0xbf800000;
      auVar99._28_4_ = 0xbf800000;
      auVar110._8_4_ = 0x3f800000;
      auVar110._0_8_ = 0x3f8000003f800000;
      auVar110._12_4_ = 0x3f800000;
      auVar110._16_4_ = 0x3f800000;
      auVar110._20_4_ = 0x3f800000;
      auVar110._24_4_ = 0x3f800000;
      auVar110._28_4_ = 0x3f800000;
      _local_a00 = vblendvps_avx(auVar110,auVar99,local_9e0);
      local_b88 = context;
LAB_00b732d4:
      if (local_b90 != local_800) {
        uVar94 = local_b90[-1];
        local_b90 = local_b90 + -1;
        while ((uVar94 & 8) == 0) {
          auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + local_b98),auVar134._0_16_);
          auVar98._0_4_ = auVar147._0_4_ * auVar118._0_4_;
          auVar98._4_4_ = auVar147._4_4_ * auVar118._4_4_;
          auVar98._8_4_ = auVar147._8_4_ * auVar118._8_4_;
          auVar98._12_4_ = auVar147._12_4_ * auVar118._12_4_;
          auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + local_ba0),auVar136._0_16_);
          auVar101._0_4_ = auVar156._0_4_ * auVar118._0_4_;
          auVar101._4_4_ = auVar156._4_4_ * auVar118._4_4_;
          auVar101._8_4_ = auVar156._8_4_ * auVar118._8_4_;
          auVar101._12_4_ = auVar156._12_4_ * auVar118._12_4_;
          auVar118 = vpmaxsd_avx(auVar98,auVar101);
          auVar98 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + uVar95),auVar139._0_16_);
          auVar102._0_4_ = auVar116._0_4_ * auVar98._0_4_;
          auVar102._4_4_ = auVar116._4_4_ * auVar98._4_4_;
          auVar102._8_4_ = auVar116._8_4_ * auVar98._8_4_;
          auVar102._12_4_ = auVar116._12_4_ * auVar98._12_4_;
          auVar98 = vpmaxsd_avx(auVar102,auVar119._0_16_);
          auVar118 = vpmaxsd_avx(auVar118,auVar98);
          auVar98 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + uVar96),auVar134._0_16_);
          auVar103._0_4_ = auVar147._0_4_ * auVar98._0_4_;
          auVar103._4_4_ = auVar147._4_4_ * auVar98._4_4_;
          auVar103._8_4_ = auVar147._8_4_ * auVar98._8_4_;
          auVar103._12_4_ = auVar147._12_4_ * auVar98._12_4_;
          auVar98 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + uVar97),auVar136._0_16_);
          auVar108._0_4_ = auVar156._0_4_ * auVar98._0_4_;
          auVar108._4_4_ = auVar156._4_4_ * auVar98._4_4_;
          auVar108._8_4_ = auVar156._8_4_ * auVar98._8_4_;
          auVar108._12_4_ = auVar156._12_4_ * auVar98._12_4_;
          auVar98 = vpminsd_avx(auVar103,auVar108);
          auVar128 = vsubps_avx(*(undefined1 (*) [16])(uVar94 + 0x20 + (uVar95 ^ 0x10)),
                                auVar139._0_16_);
          auVar109._0_4_ = auVar116._0_4_ * auVar128._0_4_;
          auVar109._4_4_ = auVar116._4_4_ * auVar128._4_4_;
          auVar109._8_4_ = auVar116._8_4_ * auVar128._8_4_;
          auVar109._12_4_ = auVar116._12_4_ * auVar128._12_4_;
          auVar128 = vpminsd_avx(auVar109,auVar131._0_16_);
          auVar98 = vpminsd_avx(auVar98,auVar128);
          auVar118 = vpcmpgtd_avx(auVar118,auVar98);
          iVar86 = vmovmskps_avx(auVar118);
          if (iVar86 == 0xf) goto LAB_00b732d4;
          bVar85 = (byte)iVar86 ^ 0xf;
          uVar88 = uVar94 & 0xfffffffffffffff0;
          lVar3 = 0;
          if (bVar85 != 0) {
            for (; (bVar85 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          uVar94 = *(ulong *)(uVar88 + lVar3 * 8);
          uVar91 = bVar85 - 1 & (uint)bVar85;
          uVar92 = (ulong)uVar91;
          if (uVar91 != 0) {
            do {
              *local_b90 = uVar94;
              local_b90 = local_b90 + 1;
              lVar3 = 0;
              if (uVar92 != 0) {
                for (; (uVar92 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              uVar94 = *(ulong *)(uVar88 + lVar3 * 8);
              uVar92 = uVar92 - 1 & uVar92;
            } while (uVar92 != 0);
          }
        }
        local_ba8 = (ulong)((uint)uVar94 & 0xf) - 8;
        uVar94 = uVar94 & 0xfffffffffffffff0;
        for (local_bb0 = 0; local_bb0 != local_ba8; local_bb0 = local_bb0 + 1) {
          lVar89 = local_bb0 * 0xe0;
          lVar3 = uVar94 + 0xd0 + lVar89;
          local_9c0 = *(undefined8 *)(lVar3 + 0x10);
          uStack_9b8 = *(undefined8 *)(lVar3 + 0x18);
          lVar3 = uVar94 + 0xc0 + lVar89;
          local_9a0 = *(undefined8 *)(lVar3 + 0x10);
          uStack_998 = *(undefined8 *)(lVar3 + 0x18);
          uStack_990 = local_9a0;
          uStack_988 = uStack_998;
          uStack_9b0 = local_9c0;
          uStack_9a8 = uStack_9b8;
          auVar115._16_16_ = *(undefined1 (*) [16])(uVar94 + 0x60 + lVar89);
          auVar115._0_16_ = *(undefined1 (*) [16])(uVar94 + lVar89);
          auVar130._16_16_ = *(undefined1 (*) [16])(uVar94 + 0x70 + lVar89);
          auVar130._0_16_ = *(undefined1 (*) [16])(uVar94 + 0x10 + lVar89);
          auVar135._16_16_ = *(undefined1 (*) [16])(uVar94 + 0x80 + lVar89);
          auVar135._0_16_ = *(undefined1 (*) [16])(uVar94 + 0x20 + lVar89);
          auVar118 = *(undefined1 (*) [16])(uVar94 + 0x30 + lVar89);
          auVar100._16_16_ = auVar118;
          auVar100._0_16_ = auVar118;
          auVar98 = *(undefined1 (*) [16])(uVar94 + 0x40 + lVar89);
          auVar104._16_16_ = auVar98;
          auVar104._0_16_ = auVar98;
          auVar128 = *(undefined1 (*) [16])(uVar94 + 0x50 + lVar89);
          auVar111._16_16_ = auVar128;
          auVar111._0_16_ = auVar128;
          auVar113 = *(undefined1 (*) [16])(uVar94 + 0x90 + lVar89);
          auVar146._16_16_ = auVar113;
          auVar146._0_16_ = auVar113;
          auVar113 = *(undefined1 (*) [16])(uVar94 + 0xa0 + lVar89);
          auVar155._16_16_ = auVar113;
          auVar155._0_16_ = auVar113;
          auVar113 = *(undefined1 (*) [16])(uVar94 + 0xb0 + lVar89);
          auVar157._16_16_ = auVar113;
          auVar157._0_16_ = auVar113;
          local_b00 = vsubps_avx(auVar115,auVar100);
          local_ac0 = vsubps_avx(auVar130,auVar104);
          auVar99 = vsubps_avx(auVar135,auVar111);
          auVar110 = vsubps_avx(auVar146,auVar115);
          auVar100 = vsubps_avx(auVar155,auVar130);
          auVar104 = vsubps_avx(auVar157,auVar135);
          fVar123 = auVar104._0_4_;
          fVar158 = local_ac0._0_4_;
          fVar8 = auVar104._4_4_;
          fVar160 = local_ac0._4_4_;
          auVar68._4_4_ = fVar160 * fVar8;
          auVar68._0_4_ = fVar158 * fVar123;
          fVar18 = auVar104._8_4_;
          fVar161 = local_ac0._8_4_;
          auVar68._8_4_ = fVar161 * fVar18;
          fVar28 = auVar104._12_4_;
          fVar162 = local_ac0._12_4_;
          auVar68._12_4_ = fVar162 * fVar28;
          fVar38 = auVar104._16_4_;
          fVar163 = local_ac0._16_4_;
          auVar68._16_4_ = fVar163 * fVar38;
          fVar48 = auVar104._20_4_;
          fVar164 = local_ac0._20_4_;
          auVar68._20_4_ = fVar164 * fVar48;
          fVar58 = auVar104._24_4_;
          fVar165 = local_ac0._24_4_;
          auVar68._24_4_ = fVar165 * fVar58;
          auVar68._28_4_ = auVar118._12_4_;
          fVar125 = auVar100._0_4_;
          fVar137 = auVar99._0_4_;
          fVar9 = auVar100._4_4_;
          fVar140 = auVar99._4_4_;
          auVar69._4_4_ = fVar140 * fVar9;
          auVar69._0_4_ = fVar137 * fVar125;
          fVar19 = auVar100._8_4_;
          fVar141 = auVar99._8_4_;
          auVar69._8_4_ = fVar141 * fVar19;
          fVar29 = auVar100._12_4_;
          fVar142 = auVar99._12_4_;
          auVar69._12_4_ = fVar142 * fVar29;
          fVar39 = auVar100._16_4_;
          fVar143 = auVar99._16_4_;
          auVar69._16_4_ = fVar143 * fVar39;
          fVar49 = auVar100._20_4_;
          fVar144 = auVar99._20_4_;
          auVar69._20_4_ = fVar144 * fVar49;
          fVar59 = auVar100._24_4_;
          uVar71 = auVar98._12_4_;
          fVar145 = auVar99._24_4_;
          auVar69._24_4_ = fVar145 * fVar59;
          auVar69._28_4_ = uVar71;
          local_b80 = vsubps_avx(auVar69,auVar68);
          fVar127 = auVar110._0_4_;
          fVar10 = auVar110._4_4_;
          auVar70._4_4_ = fVar140 * fVar10;
          auVar70._0_4_ = fVar137 * fVar127;
          fVar20 = auVar110._8_4_;
          auVar70._8_4_ = fVar141 * fVar20;
          fVar30 = auVar110._12_4_;
          auVar70._12_4_ = fVar142 * fVar30;
          fVar40 = auVar110._16_4_;
          auVar70._16_4_ = fVar143 * fVar40;
          fVar50 = auVar110._20_4_;
          auVar70._20_4_ = fVar144 * fVar50;
          fVar60 = auVar110._24_4_;
          auVar70._24_4_ = fVar145 * fVar60;
          auVar70._28_4_ = uVar71;
          fVar124 = local_b00._0_4_;
          fVar11 = local_b00._4_4_;
          auVar73._4_4_ = fVar8 * fVar11;
          auVar73._0_4_ = fVar123 * fVar124;
          fVar21 = local_b00._8_4_;
          auVar73._8_4_ = fVar18 * fVar21;
          fVar31 = local_b00._12_4_;
          auVar73._12_4_ = fVar28 * fVar31;
          fVar41 = local_b00._16_4_;
          auVar73._16_4_ = fVar38 * fVar41;
          fVar51 = local_b00._20_4_;
          auVar73._20_4_ = fVar48 * fVar51;
          fVar61 = local_b00._24_4_;
          fVar72 = auVar128._12_4_;
          auVar73._24_4_ = fVar58 * fVar61;
          auVar73._28_4_ = fVar72;
          auVar99 = vsubps_avx(auVar73,auVar70);
          auVar74._4_4_ = fVar9 * fVar11;
          auVar74._0_4_ = fVar125 * fVar124;
          auVar74._8_4_ = fVar19 * fVar21;
          auVar74._12_4_ = fVar29 * fVar31;
          auVar74._16_4_ = fVar39 * fVar41;
          auVar74._20_4_ = fVar49 * fVar51;
          auVar74._24_4_ = fVar59 * fVar61;
          auVar74._28_4_ = fVar72;
          auVar75._4_4_ = fVar160 * fVar10;
          auVar75._0_4_ = fVar158 * fVar127;
          auVar75._8_4_ = fVar161 * fVar20;
          auVar75._12_4_ = fVar162 * fVar30;
          auVar75._16_4_ = fVar163 * fVar40;
          auVar75._20_4_ = fVar164 * fVar50;
          auVar75._24_4_ = fVar165 * fVar60;
          auVar75._28_4_ = local_ac0._28_4_;
          local_ae0 = vsubps_avx(auVar75,auVar74);
          uVar87 = *(undefined4 *)&(ray->org).field_0;
          auVar159._4_4_ = uVar87;
          auVar159._0_4_ = uVar87;
          auVar159._8_4_ = uVar87;
          auVar159._12_4_ = uVar87;
          auVar159._16_4_ = uVar87;
          auVar159._20_4_ = uVar87;
          auVar159._24_4_ = uVar87;
          auVar159._28_4_ = uVar87;
          uVar87 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar166._4_4_ = uVar87;
          auVar166._0_4_ = uVar87;
          auVar166._8_4_ = uVar87;
          auVar166._12_4_ = uVar87;
          auVar166._16_4_ = uVar87;
          auVar166._20_4_ = uVar87;
          auVar166._24_4_ = uVar87;
          auVar166._28_4_ = uVar87;
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar167._4_4_ = uVar1;
          auVar167._0_4_ = uVar1;
          auVar167._8_4_ = uVar1;
          auVar167._12_4_ = uVar1;
          auVar167._16_4_ = uVar1;
          auVar167._20_4_ = uVar1;
          auVar167._24_4_ = uVar1;
          auVar167._28_4_ = uVar1;
          fVar117 = (ray->dir).field_0.m128[1];
          auVar68 = vsubps_avx(auVar115,auVar159);
          fVar121 = (ray->dir).field_0.m128[2];
          auVar69 = vsubps_avx(auVar130,auVar166);
          auVar70 = vsubps_avx(auVar135,auVar167);
          fVar126 = auVar70._0_4_;
          fVar12 = auVar70._4_4_;
          auVar76._4_4_ = fVar117 * fVar12;
          auVar76._0_4_ = fVar117 * fVar126;
          fVar22 = auVar70._8_4_;
          auVar76._8_4_ = fVar117 * fVar22;
          fVar32 = auVar70._12_4_;
          auVar76._12_4_ = fVar117 * fVar32;
          fVar42 = auVar70._16_4_;
          auVar76._16_4_ = fVar117 * fVar42;
          fVar52 = auVar70._20_4_;
          auVar76._20_4_ = fVar117 * fVar52;
          fVar62 = auVar70._24_4_;
          auVar76._24_4_ = fVar117 * fVar62;
          auVar76._28_4_ = uVar87;
          fVar120 = auVar69._0_4_;
          fVar13 = auVar69._4_4_;
          auVar77._4_4_ = fVar121 * fVar13;
          auVar77._0_4_ = fVar121 * fVar120;
          fVar23 = auVar69._8_4_;
          auVar77._8_4_ = fVar121 * fVar23;
          fVar33 = auVar69._12_4_;
          auVar77._12_4_ = fVar121 * fVar33;
          fVar43 = auVar69._16_4_;
          auVar77._16_4_ = fVar121 * fVar43;
          fVar53 = auVar69._20_4_;
          auVar77._20_4_ = fVar121 * fVar53;
          fVar63 = auVar69._24_4_;
          auVar77._24_4_ = fVar121 * fVar63;
          auVar77._28_4_ = uVar1;
          auVar69 = vsubps_avx(auVar77,auVar76);
          fVar122 = (ray->dir).field_0.m128[0];
          fVar4 = auVar68._0_4_;
          fVar14 = auVar68._4_4_;
          auVar78._4_4_ = fVar121 * fVar14;
          auVar78._0_4_ = fVar121 * fVar4;
          fVar24 = auVar68._8_4_;
          auVar78._8_4_ = fVar121 * fVar24;
          fVar34 = auVar68._12_4_;
          auVar78._12_4_ = fVar121 * fVar34;
          fVar44 = auVar68._16_4_;
          auVar78._16_4_ = fVar121 * fVar44;
          fVar54 = auVar68._20_4_;
          auVar78._20_4_ = fVar121 * fVar54;
          fVar64 = auVar68._24_4_;
          auVar78._24_4_ = fVar121 * fVar64;
          auVar78._28_4_ = local_b80._28_4_;
          auVar79._4_4_ = fVar122 * fVar12;
          auVar79._0_4_ = fVar122 * fVar126;
          auVar79._8_4_ = fVar122 * fVar22;
          auVar79._12_4_ = fVar122 * fVar32;
          auVar79._16_4_ = fVar122 * fVar42;
          auVar79._20_4_ = fVar122 * fVar52;
          auVar79._24_4_ = fVar122 * fVar62;
          auVar79._28_4_ = uVar71;
          auVar68 = vsubps_avx(auVar79,auVar78);
          auVar80._4_4_ = fVar122 * fVar13;
          auVar80._0_4_ = fVar122 * fVar120;
          auVar80._8_4_ = fVar122 * fVar23;
          auVar80._12_4_ = fVar122 * fVar33;
          auVar80._16_4_ = fVar122 * fVar43;
          auVar80._20_4_ = fVar122 * fVar53;
          auVar80._24_4_ = fVar122 * fVar63;
          auVar80._28_4_ = uVar71;
          auVar81._4_4_ = fVar117 * fVar14;
          auVar81._0_4_ = fVar117 * fVar4;
          auVar81._8_4_ = fVar117 * fVar24;
          auVar81._12_4_ = fVar117 * fVar34;
          auVar81._16_4_ = fVar117 * fVar44;
          auVar81._20_4_ = fVar117 * fVar54;
          auVar81._24_4_ = fVar117 * fVar64;
          auVar81._28_4_ = fVar72;
          auVar70 = vsubps_avx(auVar81,auVar80);
          fVar5 = local_ae0._0_4_;
          fVar15 = local_ae0._4_4_;
          fVar25 = local_ae0._8_4_;
          fVar35 = local_ae0._12_4_;
          fVar45 = local_ae0._16_4_;
          fVar55 = local_ae0._20_4_;
          fVar65 = local_ae0._24_4_;
          fVar6 = auVar99._0_4_;
          fVar16 = auVar99._4_4_;
          fVar26 = auVar99._8_4_;
          fVar36 = auVar99._12_4_;
          fVar46 = auVar99._16_4_;
          fVar56 = auVar99._20_4_;
          fVar66 = auVar99._24_4_;
          fVar7 = local_b80._0_4_;
          fVar17 = local_b80._4_4_;
          fVar27 = local_b80._8_4_;
          fVar37 = local_b80._12_4_;
          fVar47 = local_b80._16_4_;
          fVar57 = local_b80._20_4_;
          fVar67 = local_b80._24_4_;
          auVar112._0_4_ = fVar122 * fVar7 + fVar117 * fVar6 + fVar121 * fVar5;
          auVar112._4_4_ = fVar122 * fVar17 + fVar117 * fVar16 + fVar121 * fVar15;
          auVar112._8_4_ = fVar122 * fVar27 + fVar117 * fVar26 + fVar121 * fVar25;
          auVar112._12_4_ = fVar122 * fVar37 + fVar117 * fVar36 + fVar121 * fVar35;
          auVar112._16_4_ = fVar122 * fVar47 + fVar117 * fVar46 + fVar121 * fVar45;
          auVar112._20_4_ = fVar122 * fVar57 + fVar117 * fVar56 + fVar121 * fVar55;
          auVar112._24_4_ = fVar122 * fVar67 + fVar117 * fVar66 + fVar121 * fVar65;
          auVar112._28_4_ = fVar121 + fVar121 + fVar72;
          auVar105._8_4_ = 0x80000000;
          auVar105._0_8_ = 0x8000000080000000;
          auVar105._12_4_ = 0x80000000;
          auVar105._16_4_ = 0x80000000;
          auVar105._20_4_ = 0x80000000;
          auVar105._24_4_ = 0x80000000;
          auVar105._28_4_ = 0x80000000;
          auVar99 = vandps_avx(auVar112,auVar105);
          uVar91 = auVar99._0_4_;
          auVar132._0_4_ =
               (float)(uVar91 ^ (uint)(fVar127 * auVar69._0_4_ +
                                      fVar125 * auVar68._0_4_ + fVar123 * auVar70._0_4_));
          uVar148 = auVar99._4_4_;
          auVar132._4_4_ =
               (float)(uVar148 ^
                      (uint)(fVar10 * auVar69._4_4_ + fVar9 * auVar68._4_4_ + fVar8 * auVar70._4_4_)
                      );
          uVar149 = auVar99._8_4_;
          auVar132._8_4_ =
               (float)(uVar149 ^
                      (uint)(fVar20 * auVar69._8_4_ +
                            fVar19 * auVar68._8_4_ + fVar18 * auVar70._8_4_));
          uVar150 = auVar99._12_4_;
          auVar132._12_4_ =
               (float)(uVar150 ^
                      (uint)(fVar30 * auVar69._12_4_ +
                            fVar29 * auVar68._12_4_ + fVar28 * auVar70._12_4_));
          uVar151 = auVar99._16_4_;
          auVar132._16_4_ =
               (float)(uVar151 ^
                      (uint)(fVar40 * auVar69._16_4_ +
                            fVar39 * auVar68._16_4_ + fVar38 * auVar70._16_4_));
          uVar152 = auVar99._20_4_;
          auVar132._20_4_ =
               (float)(uVar152 ^
                      (uint)(fVar50 * auVar69._20_4_ +
                            fVar49 * auVar68._20_4_ + fVar48 * auVar70._20_4_));
          uVar153 = auVar99._24_4_;
          auVar132._24_4_ =
               (float)(uVar153 ^
                      (uint)(fVar60 * auVar69._24_4_ +
                            fVar59 * auVar68._24_4_ + fVar58 * auVar70._24_4_));
          uVar154 = auVar99._28_4_;
          auVar132._28_4_ =
               (float)(uVar154 ^ (uint)(auVar110._28_4_ + auVar100._28_4_ + auVar104._28_4_));
          auVar138._0_4_ =
               (float)(uVar91 ^ (uint)(auVar69._0_4_ * fVar124 +
                                      auVar68._0_4_ * fVar158 + fVar137 * auVar70._0_4_));
          auVar138._4_4_ =
               (float)(uVar148 ^
                      (uint)(auVar69._4_4_ * fVar11 +
                            auVar68._4_4_ * fVar160 + fVar140 * auVar70._4_4_));
          auVar138._8_4_ =
               (float)(uVar149 ^
                      (uint)(auVar69._8_4_ * fVar21 +
                            auVar68._8_4_ * fVar161 + fVar141 * auVar70._8_4_));
          auVar138._12_4_ =
               (float)(uVar150 ^
                      (uint)(auVar69._12_4_ * fVar31 +
                            auVar68._12_4_ * fVar162 + fVar142 * auVar70._12_4_));
          auVar138._16_4_ =
               (float)(uVar151 ^
                      (uint)(auVar69._16_4_ * fVar41 +
                            auVar68._16_4_ * fVar163 + fVar143 * auVar70._16_4_));
          auVar138._20_4_ =
               (float)(uVar152 ^
                      (uint)(auVar69._20_4_ * fVar51 +
                            auVar68._20_4_ * fVar164 + fVar144 * auVar70._20_4_));
          auVar138._24_4_ =
               (float)(uVar153 ^
                      (uint)(auVar69._24_4_ * fVar61 +
                            auVar68._24_4_ * fVar165 + fVar145 * auVar70._24_4_));
          auVar138._28_4_ = (float)(uVar154 ^ (uint)(auVar68._28_4_ + auVar70._28_4_ + -0.0));
          auVar110 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar99 = vcmpps_avx(auVar132,auVar110,5);
          auVar110 = vcmpps_avx(auVar138,auVar110,5);
          auVar99 = vandps_avx(auVar99,auVar110);
          auVar106._8_4_ = 0x7fffffff;
          auVar106._0_8_ = 0x7fffffff7fffffff;
          auVar106._12_4_ = 0x7fffffff;
          auVar106._16_4_ = 0x7fffffff;
          auVar106._20_4_ = 0x7fffffff;
          auVar106._24_4_ = 0x7fffffff;
          auVar106._28_4_ = 0x7fffffff;
          local_920 = vandps_avx(auVar112,auVar106);
          auVar110 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar112,4);
          auVar99 = vandps_avx(auVar99,auVar110);
          auVar107._0_4_ = auVar138._0_4_ + auVar132._0_4_;
          auVar107._4_4_ = auVar138._4_4_ + auVar132._4_4_;
          auVar107._8_4_ = auVar138._8_4_ + auVar132._8_4_;
          auVar107._12_4_ = auVar138._12_4_ + auVar132._12_4_;
          auVar107._16_4_ = auVar138._16_4_ + auVar132._16_4_;
          auVar107._20_4_ = auVar138._20_4_ + auVar132._20_4_;
          auVar107._24_4_ = auVar138._24_4_ + auVar132._24_4_;
          auVar107._28_4_ = auVar138._28_4_ + auVar132._28_4_;
          auVar100 = vcmpps_avx(auVar107,local_920,2);
          auVar110 = vandps_avx(auVar99,auVar100);
          auVar104 = local_a20 & auVar110;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            auVar110 = vandps_avx(auVar110,local_a20);
            local_940._0_4_ =
                 (float)(uVar91 ^ (uint)(fVar7 * fVar4 + fVar6 * fVar120 + fVar126 * fVar5));
            local_940._4_4_ =
                 (float)(uVar148 ^ (uint)(fVar17 * fVar14 + fVar16 * fVar13 + fVar12 * fVar15));
            local_940._8_4_ =
                 (float)(uVar149 ^ (uint)(fVar27 * fVar24 + fVar26 * fVar23 + fVar22 * fVar25));
            local_940._12_4_ =
                 (float)(uVar150 ^ (uint)(fVar37 * fVar34 + fVar36 * fVar33 + fVar32 * fVar35));
            local_940._16_4_ =
                 (float)(uVar151 ^ (uint)(fVar47 * fVar44 + fVar46 * fVar43 + fVar42 * fVar45));
            local_940._20_4_ =
                 (float)(uVar152 ^ (uint)(fVar57 * fVar54 + fVar56 * fVar53 + fVar52 * fVar55));
            local_940._24_4_ =
                 (float)(uVar153 ^ (uint)(fVar67 * fVar64 + fVar66 * fVar63 + fVar62 * fVar65));
            local_940._28_4_ = uVar154 ^ (uint)(auVar100._28_4_ + auVar100._28_4_ + auVar99._28_4_);
            fVar117 = (ray->org).field_0.m128[3];
            fVar121 = local_920._0_4_;
            fVar122 = local_920._4_4_;
            auVar82._4_4_ = fVar122 * fVar117;
            auVar82._0_4_ = fVar121 * fVar117;
            fVar123 = local_920._8_4_;
            auVar82._8_4_ = fVar123 * fVar117;
            fVar125 = local_920._12_4_;
            auVar82._12_4_ = fVar125 * fVar117;
            fVar127 = local_920._16_4_;
            auVar82._16_4_ = fVar127 * fVar117;
            fVar124 = local_920._20_4_;
            auVar82._20_4_ = fVar124 * fVar117;
            fVar126 = local_920._24_4_;
            auVar82._24_4_ = fVar126 * fVar117;
            auVar82._28_4_ = fVar117;
            auVar99 = vcmpps_avx(auVar82,local_940,1);
            fVar117 = ray->tfar;
            auVar83._4_4_ = fVar122 * fVar117;
            auVar83._0_4_ = fVar121 * fVar117;
            auVar83._8_4_ = fVar123 * fVar117;
            auVar83._12_4_ = fVar125 * fVar117;
            auVar83._16_4_ = fVar127 * fVar117;
            auVar83._20_4_ = fVar124 * fVar117;
            auVar83._24_4_ = fVar126 * fVar117;
            auVar83._28_4_ = fVar117;
            auVar100 = vcmpps_avx(local_940,auVar83,2);
            auVar99 = vandps_avx(auVar100,auVar99);
            auVar100 = auVar110 & auVar99;
            if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar100 >> 0x7f,0) != '\0') ||
                  (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0xbf,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar100[0x1f] < '\0') {
              local_8e0 = vandps_avx(auVar110,auVar99);
              auVar99 = vsubps_avx(local_920,auVar138);
              local_980 = vblendvps_avx(auVar132,auVar99,local_9e0);
              auVar99 = vsubps_avx(local_920,auVar132);
              local_960 = vblendvps_avx(auVar138,auVar99,local_9e0);
              uStack_844 = local_9e0._28_4_;
              local_860[0] = fVar7 * (float)local_a00._0_4_;
              local_860[1] = fVar17 * (float)local_a00._4_4_;
              local_860[2] = fVar27 * fStack_9f8;
              local_860[3] = fVar37 * fStack_9f4;
              fStack_850 = fVar47 * fStack_9f0;
              fStack_84c = fVar57 * fStack_9ec;
              fStack_848 = fVar67 * fStack_9e8;
              local_840[0] = fVar6 * (float)local_a00._0_4_;
              local_840[1] = fVar16 * (float)local_a00._4_4_;
              local_840[2] = fVar26 * fStack_9f8;
              local_840[3] = fVar36 * fStack_9f4;
              fStack_830 = fVar46 * fStack_9f0;
              fStack_82c = fVar56 * fStack_9ec;
              fStack_828 = fVar66 * fStack_9e8;
              uStack_824 = uStack_844;
              local_820[0] = (float)local_a00._0_4_ * fVar5;
              local_820[1] = (float)local_a00._4_4_ * fVar15;
              local_820[2] = fStack_9f8 * fVar25;
              local_820[3] = fStack_9f4 * fVar35;
              fStack_810 = fStack_9f0 * fVar45;
              fStack_80c = fStack_9ec * fVar55;
              fStack_808 = fStack_9e8 * fVar65;
              uStack_804 = uStack_844;
              auVar99 = vrcpps_avx(local_920);
              fVar117 = auVar99._0_4_;
              fVar120 = auVar99._4_4_;
              auVar84._4_4_ = fVar122 * fVar120;
              auVar84._0_4_ = fVar121 * fVar117;
              fVar121 = auVar99._8_4_;
              auVar84._8_4_ = fVar123 * fVar121;
              fVar122 = auVar99._12_4_;
              auVar84._12_4_ = fVar125 * fVar122;
              fVar123 = auVar99._16_4_;
              auVar84._16_4_ = fVar127 * fVar123;
              fVar125 = auVar99._20_4_;
              auVar84._20_4_ = fVar124 * fVar125;
              fVar127 = auVar99._24_4_;
              auVar84._24_4_ = fVar126 * fVar127;
              auVar84._28_4_ = local_920._28_4_;
              auVar133._8_4_ = 0x3f800000;
              auVar133._0_8_ = 0x3f8000003f800000;
              auVar133._12_4_ = 0x3f800000;
              auVar133._16_4_ = 0x3f800000;
              auVar133._20_4_ = 0x3f800000;
              auVar133._24_4_ = 0x3f800000;
              auVar133._28_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar133,auVar84);
              fVar117 = fVar117 + fVar117 * auVar99._0_4_;
              fVar120 = fVar120 + fVar120 * auVar99._4_4_;
              fVar121 = fVar121 + fVar121 * auVar99._8_4_;
              fVar122 = fVar122 + fVar122 * auVar99._12_4_;
              fVar123 = fVar123 + fVar123 * auVar99._16_4_;
              fVar125 = fVar125 + fVar125 * auVar99._20_4_;
              fVar127 = fVar127 + fVar127 * auVar99._24_4_;
              local_880._4_4_ = fVar120 * local_940._4_4_;
              local_880._0_4_ = fVar117 * local_940._0_4_;
              local_880._8_4_ = fVar121 * local_940._8_4_;
              local_880._12_4_ = fVar122 * local_940._12_4_;
              local_880._16_4_ = fVar123 * local_940._16_4_;
              local_880._20_4_ = fVar125 * local_940._20_4_;
              local_880._24_4_ = fVar127 * local_940._24_4_;
              local_880._28_4_ = local_940._28_4_;
              local_8c0[0] = local_980._0_4_ * fVar117;
              local_8c0[1] = local_980._4_4_ * fVar120;
              local_8c0[2] = local_980._8_4_ * fVar121;
              local_8c0[3] = local_980._12_4_ * fVar122;
              fStack_8b0 = local_980._16_4_ * fVar123;
              fStack_8ac = local_980._20_4_ * fVar125;
              fStack_8a8 = local_980._24_4_ * fVar127;
              uStack_8a4 = local_980._28_4_;
              local_8a0._4_4_ = local_960._4_4_ * fVar120;
              local_8a0._0_4_ = local_960._0_4_ * fVar117;
              local_8a0._8_4_ = local_960._8_4_ * fVar121;
              local_8a0._12_4_ = local_960._12_4_ * fVar122;
              local_8a0._16_4_ = local_960._16_4_ * fVar123;
              local_8a0._20_4_ = local_960._20_4_ * fVar125;
              local_8a0._24_4_ = local_960._24_4_ * fVar127;
              local_8a0._28_4_ = local_980._28_4_;
              uVar87 = vmovmskps_avx(local_8e0);
              uVar88 = CONCAT44((int)((ulong)lVar89 >> 0x20),uVar87);
              local_ae0._0_8_ = local_b88->scene;
              pSVar93 = local_b88->scene;
              do {
                local_ac0._0_8_ = uVar88;
                uVar92 = 0;
                if (uVar88 != 0) {
                  for (; (uVar88 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                  }
                }
                local_b00._0_8_ = uVar92;
                local_b48 = *(uint *)((long)&local_9a0 + uVar92 * 4);
                uVar90 = CONCAT44(0,local_b48);
                local_b80._0_8_ = uVar90;
                local_bb8 = (pSVar93->geometries).items[uVar90].ptr;
                if ((local_bb8->mask & ray->mask) == 0) {
                  uVar88 = uVar88 ^ 1L << (uVar92 & 0x3f);
                }
                else {
                  if ((local_b88->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_b80._0_8_ = ray, local_bb8->occlusionFilterN == (RTCFilterFunctionN)0x0)
                     ) goto LAB_00b739ac;
                  local_bc0 = local_b88->args;
                  local_b30.context = local_b88->user;
                  local_b60 = local_860[uVar92];
                  local_b5c = local_840[uVar92];
                  local_b58 = local_820[uVar92];
                  local_b54 = local_8c0[uVar92];
                  local_b50 = *(undefined4 *)(local_8a0 + uVar92 * 4);
                  local_b4c = *(undefined4 *)((long)&local_9c0 + uVar92 * 4);
                  local_b44 = (local_b30.context)->instID[0];
                  local_b40 = (local_b30.context)->instPrimID[0];
                  fVar117 = ray->tfar;
                  ray->tfar = *(float *)(local_880 + uVar92 * 4);
                  local_bc4 = -1;
                  local_b30.valid = &local_bc4;
                  local_b30.geometryUserPtr = local_bb8->userPtr;
                  local_b80._0_8_ = ray;
                  local_b30.hit = (RTCHitN *)&local_b60;
                  local_b30.N = 1;
                  local_b30.ray = (RTCRayN *)ray;
                  if ((local_bb8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*local_bb8->occlusionFilterN)(&local_b30), *local_b30.valid != 0)) {
                    if ((local_bc0->filter == (RTCFilterFunctionN)0x0) ||
                       (((local_bc0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_bb8->field_8).field_0x2 & 0x40) == 0)))) {
LAB_00b739ac:
                      ((Ray *)local_b80._0_8_)->tfar = -INFINITY;
                      return;
                    }
                    (*local_bc0->filter)(&local_b30);
                    if (*local_b30.valid != 0) goto LAB_00b739ac;
                  }
                  *(float *)(local_b80._0_8_ + 0x20) = fVar117;
                  uVar88 = local_ac0._0_8_ ^ 1L << (local_b00._0_8_ & 0x3f);
                  ray = (Ray *)local_b80._0_8_;
                }
                pSVar93 = (Scene *)local_ae0._0_8_;
              } while (uVar88 != 0);
            }
          }
          auVar134 = ZEXT1664(local_a30);
          auVar136 = ZEXT1664(local_a40);
          auVar139 = ZEXT1664(local_a50);
          auVar147 = ZEXT1664(local_a60);
          auVar156 = ZEXT1664(local_a70);
          auVar116 = ZEXT1664(local_a80);
          auVar119 = ZEXT1664(local_a90);
          auVar131 = ZEXT1664(local_aa0);
        }
        goto LAB_00b732d4;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }